

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O1

bool __thiscall
cmsys::SystemInformationImplementation::RetrieveInformationFromCpuInfoFile
          (SystemInformationImplementation *this)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  double dVar3;
  _Alloc_hider _Var4;
  SystemInformationImplementation *pSVar5;
  undefined8 *puVar6;
  int iVar7;
  int iVar8;
  FILE *__stream;
  long lVar9;
  ulonglong uVar10;
  long *plVar11;
  long *plVar12;
  char cVar13;
  undefined8 *puVar14;
  char *__nptr;
  uint uVar15;
  bool bVar16;
  float fVar17;
  string buffer;
  string cpuflags;
  string cpurev;
  string familyStr;
  string CPUSpeed;
  vector<const_char_*,_std::allocator<const_char_*>_> cachename;
  string Cores;
  string idc;
  set<int,_std::less<int>,_std::allocator<int>_> PhysicalIDs;
  undefined1 *local_3d0;
  long local_3c8;
  undefined1 local_3c0;
  undefined7 uStack_3bf;
  string local_3b0;
  string local_390;
  SystemInformationImplementation *local_370;
  string local_368;
  string local_348;
  undefined8 *local_328;
  undefined8 *puStack_320;
  long local_318;
  string local_308;
  FILE *local_2e8;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  local_3d0 = &local_3c0;
  local_3c8 = 0;
  local_3c0 = 0;
  __stream = fopen("/proc/cpuinfo","r");
  if (__stream == (FILE *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Problem opening /proc/cpuinfo",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    goto LAB_0059c017;
  }
  iVar7 = feof(__stream);
  cVar13 = -2;
  if (iVar7 == 0) {
    do {
      fgetc(__stream);
      std::__cxx11::string::push_back((char)&local_3d0);
      iVar7 = feof(__stream);
      cVar13 = cVar13 + '\x01';
    } while (iVar7 == 0);
  }
  fclose(__stream);
  std::__cxx11::string::resize((ulong)&local_3d0,cVar13);
  lVar9 = std::__cxx11::string::find((char *)&local_3d0,0x7b368b,0);
  if (lVar9 != -1) {
    do {
      this->NumberOfLogicalCPU = this->NumberOfLogicalCPU + 1;
      lVar9 = std::__cxx11::string::find((char *)&local_3d0,0x7b368b,lVar9 + 1);
    } while (lVar9 != -1);
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char*>((string *)&local_e0,local_3d0,local_3d0 + local_3c8);
  ExtractValueFromCpuInfoFile(&local_c0,this,&local_e0,"physical id",0);
  local_2e8 = __stream;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_370 = this;
  if (this->CurrentPositionInFile != 0xffffffffffffffff) {
    do {
      local_348._M_dataplus._M_p._0_4_ = atoi(local_c0._M_dataplus._M_p);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_60,(int *)&local_348);
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_100,local_3d0,local_3d0 + local_3c8);
      ExtractValueFromCpuInfoFile
                (&local_308,local_370,&local_100,"physical id",local_370->CurrentPositionInFile + 1)
      ;
      std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
    } while (local_370->CurrentPositionInFile != 0xffffffffffffffff);
  }
  bVar16 = local_60._M_impl.super__Rb_tree_header._M_node_count == 0;
  iVar7 = (int)local_60._M_impl.super__Rb_tree_header._M_node_count;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_120,local_3d0,local_3d0 + local_3c8);
  pSVar5 = local_370;
  ExtractValueFromCpuInfoFile(&local_308,local_370,&local_120,"cpu cores",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if (local_308._M_string_length == 0) {
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_140,local_3d0,local_3d0 + local_3c8);
    ExtractValueFromCpuInfoFile(&local_348,pSVar5,&local_140,"ncpus probed",0);
    std::__cxx11::string::operator=((string *)&local_308,(string *)&local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_348._M_dataplus._M_p._4_4_,(int)local_348._M_dataplus._M_p) !=
        &local_348.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_348._M_dataplus._M_p._4_4_,(int)local_348._M_dataplus._M_p),
                      local_348.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
  }
  iVar8 = atoi(local_308._M_dataplus._M_p);
  iVar7 = (iVar7 + (uint)bVar16) * (iVar8 + (uint)(iVar8 == 0));
  uVar15 = iVar7 + (uint)(iVar7 == 0);
  pSVar5->NumberOfPhysicalCPU = uVar15;
  if (pSVar5->NumberOfLogicalCPU == 0) {
    pSVar5->NumberOfLogicalCPU = uVar15;
  }
  (pSVar5->Features).ExtendedFeatures.LogicalProcessorsPerPhysical =
       pSVar5->NumberOfLogicalCPU / uVar15;
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_160,local_3d0,local_3d0 + local_3c8);
  ExtractValueFromCpuInfoFile(&local_348,pSVar5,&local_160,"cpu MHz",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (local_348._M_string_length == 0) {
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_180,local_3d0,local_3d0 + local_3c8);
    ExtractValueFromCpuInfoFile(&local_368,pSVar5,&local_180,"Cpu0ClkTck",0);
    std::__cxx11::string::operator=((string *)&local_348,(string *)&local_368);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
    if (local_348._M_string_length == 0) {
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a0,local_3d0,local_3d0 + local_3c8);
      ExtractValueFromCpuInfoFile(&local_368,pSVar5,&local_1a0,"CPU0ClkTck",0);
      std::__cxx11::string::operator=((string *)&local_348,(string *)&local_368);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != &local_368.field_2) {
        operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      __nptr = (char *)CONCAT44(local_348._M_dataplus._M_p._4_4_,(int)local_348._M_dataplus._M_p);
      iVar7 = 10;
    }
    else {
      __nptr = (char *)CONCAT44(local_348._M_dataplus._M_p._4_4_,(int)local_348._M_dataplus._M_p);
      iVar7 = 0x10;
    }
    uVar10 = strtoull(__nptr,(char **)0x0,iVar7);
    fVar17 = (float)uVar10 / 1e+06;
  }
  else {
    dVar3 = atof((char *)CONCAT44(local_348._M_dataplus._M_p._4_4_,(int)local_348._M_dataplus._M_p))
    ;
    fVar17 = (float)dVar3;
  }
  pSVar5->CPUSpeedInMHz = fVar17;
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1c0,local_3d0,local_3d0 + local_3c8);
  ExtractValueFromCpuInfoFile(&local_368,pSVar5,&local_1c0,"cpu family",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if (local_368._M_string_length == 0) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_1e0,local_3d0,local_3d0 + local_3c8);
    ExtractValueFromCpuInfoFile(&local_390,pSVar5,&local_1e0,"CPU architecture",0);
    std::__cxx11::string::operator=((string *)&local_368,(string *)&local_390);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  iVar7 = atoi(local_368._M_dataplus._M_p);
  (pSVar5->ChipID).Family = iVar7;
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_200,local_3d0,local_3d0 + local_3c8);
  ExtractValueFromCpuInfoFile(&local_390,pSVar5,&local_200,"vendor_id",0);
  std::__cxx11::string::operator=((string *)&(pSVar5->ChipID).Vendor,(string *)&local_390);
  paVar2 = &local_390.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  FindManufacturer(pSVar5,&local_368);
  if (((pSVar5->ChipID).Family == 0) && (pSVar5->ChipManufacturer == HP)) {
    iVar7 = std::__cxx11::string::compare((char *)&local_368);
    if (iVar7 == 0) {
      iVar7 = 0x11a;
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)&local_368);
      if (iVar7 != 0) goto LAB_0059b84d;
      iVar7 = 0x200;
    }
    (pSVar5->ChipID).Family = iVar7;
  }
LAB_0059b84d:
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_220,local_3d0,local_3d0 + local_3c8);
  ExtractValueFromCpuInfoFile(&local_390,pSVar5,&local_220,"model",0);
  _Var4._M_p = local_390._M_dataplus._M_p;
  iVar7 = atoi(local_390._M_dataplus._M_p);
  (pSVar5->ChipID).Model = iVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var4._M_p != paVar2) {
    operator_delete(_Var4._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  bVar16 = RetrieveClassicalCPUIdentity(pSVar5);
  if (!bVar16) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_240,local_3d0,local_3d0 + local_3c8);
    ExtractValueFromCpuInfoFile(&local_390,pSVar5,&local_240,"cpu",0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if (local_390._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&(pSVar5->ChipID).ProcessorName);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != paVar2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
  }
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_260,local_3d0,local_3d0 + local_3c8);
  ExtractValueFromCpuInfoFile(&local_390,pSVar5,&local_260,"stepping",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if (local_390._M_string_length == 0) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_280,local_3d0,local_3d0 + local_3c8);
    ExtractValueFromCpuInfoFile(&local_3b0,pSVar5,&local_280,"CPU revision",0);
    std::__cxx11::string::operator=((string *)&local_390,(string *)&local_3b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
  }
  iVar7 = atoi(local_390._M_dataplus._M_p);
  (pSVar5->ChipID).Revision = iVar7;
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2a0,local_3d0,local_3d0 + local_3c8);
  ExtractValueFromCpuInfoFile(&local_3b0,pSVar5,&local_2a0,"model name",0);
  std::__cxx11::string::operator=((string *)&(pSVar5->ChipID).ModelName,(string *)&local_3b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  local_328 = (undefined8 *)0x0;
  local_318 = 0;
  puStack_320 = (undefined8 *)0x0;
  local_3b0._M_dataplus._M_p = "cache size";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_328,(char **)&local_3b0);
  local_3b0._M_dataplus._M_p = "I-cache";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_328,(char **)&local_3b0);
  local_3b0._M_dataplus._M_p = "D-cache";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_328,(char **)&local_3b0);
  puVar6 = puStack_320;
  (pSVar5->Features).L1CacheSize = 0;
  if (local_328 != puStack_320) {
    puVar14 = local_328;
    do {
      local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2c0,local_3d0,local_3d0 + local_3c8);
      ExtractValueFromCpuInfoFile(&local_3b0,local_370,&local_2c0,(char *)*puVar14,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
      if (local_3b0._M_string_length != 0) {
        lVar9 = std::__cxx11::string::find((char *)&local_3b0,0x7b3756,0);
        if (lVar9 != -1) {
          std::__cxx11::string::resize((ulong)&local_3b0,(char)lVar9);
        }
        iVar7 = atoi(local_3b0._M_dataplus._M_p);
        piVar1 = &(local_370->Features).L1CacheSize;
        *piVar1 = *piVar1 + iVar7;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
        operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
      }
      puVar14 = puVar14 + 1;
    } while (puVar14 != puVar6);
  }
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2e0,local_3d0,local_3d0 + local_3c8);
  pSVar5 = local_370;
  ExtractValueFromCpuInfoFile(&local_3b0,local_370,&local_2e0,"flags",0);
  __stream = local_2e8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if (local_390._M_string_length != 0) {
    std::operator+(&local_a0," ",&local_3b0);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_a0);
    plVar12 = plVar11 + 2;
    if ((long *)*plVar11 == plVar12) {
      local_70 = *plVar12;
      lStack_68 = plVar11[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar12;
      local_80 = (long *)*plVar11;
    }
    local_78 = plVar11[1];
    *plVar11 = (long)plVar12;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_3b0,(string *)&local_80);
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    lVar9 = std::__cxx11::string::find((char *)&local_3b0,0x7b375a,0);
    if (lVar9 != -1) {
      (pSVar5->Features).HasFPU = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&local_3b0,0x7b3760,0);
    if (lVar9 != -1) {
      (pSVar5->Features).HasTSC = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&local_3b0,0x7b3766,0);
    if (lVar9 != -1) {
      (pSVar5->Features).HasMMX = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&local_3b0,0x7b376c,0);
    if (lVar9 != -1) {
      (pSVar5->Features).HasSSE = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&local_3b0,0x7b3772,0);
    if (lVar9 != -1) {
      (pSVar5->Features).HasSSE2 = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&local_3b0,0x7b3779,0);
    if (lVar9 != -1) {
      (pSVar5->Features).HasAPIC = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&local_3b0,0x7b3780,0);
    if (lVar9 != -1) {
      (pSVar5->Features).HasCMOV = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&local_3b0,0x7b3787,0);
    if (lVar9 != -1) {
      (pSVar5->Features).HasMTRR = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&local_3b0,0x7b378e,0);
    if (lVar9 != -1) {
      (pSVar5->Features).HasACPI = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&local_3b0,0x7b3795,0);
    if (lVar9 != -1) {
      (pSVar5->Features).ExtendedFeatures.Has3DNow = true;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  if (local_328 != (undefined8 *)0x0) {
    operator_delete(local_328,local_318 - (long)local_328);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_348._M_dataplus._M_p._4_4_,(int)local_348._M_dataplus._M_p) !=
      &local_348.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_348._M_dataplus._M_p._4_4_,(int)local_348._M_dataplus._M_p),
                    local_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
LAB_0059c017:
  if (local_3d0 != &local_3c0) {
    operator_delete(local_3d0,CONCAT71(uStack_3bf,local_3c0) + 1);
  }
  return __stream != (FILE *)0x0;
}

Assistant:

bool SystemInformationImplementation::RetrieveInformationFromCpuInfoFile()
{
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  std::string buffer;

  FILE* fd = fopen("/proc/cpuinfo", "r");
  if (!fd) {
    std::cout << "Problem opening /proc/cpuinfo" << std::endl;
    return false;
  }

  size_t fileSize = 0;
  while (!feof(fd)) {
    buffer += static_cast<char>(fgetc(fd));
    fileSize++;
  }
  fclose(fd);
  buffer.resize(fileSize - 2);
  // Number of logical CPUs (combination of multiple processors, multi-core
  // and SMT)
  size_t pos = buffer.find("processor\t");
  while (pos != std::string::npos) {
    this->NumberOfLogicalCPU++;
    pos = buffer.find("processor\t", pos + 1);
  }

#if defined(__linux) || defined(__CYGWIN__)
  // Count sockets.
  std::set<int> PhysicalIDs;
  std::string idc = this->ExtractValueFromCpuInfoFile(buffer, "physical id");
  while (this->CurrentPositionInFile != std::string::npos) {
    int id = atoi(idc.c_str());
    PhysicalIDs.insert(id);
    idc = this->ExtractValueFromCpuInfoFile(buffer, "physical id",
                                            this->CurrentPositionInFile + 1);
  }
  uint64_t NumberOfSockets = PhysicalIDs.size();
  NumberOfSockets = std::max(NumberOfSockets, (uint64_t)1);
  // Physical ids returned by Linux don't distinguish cores.
  // We want to record the total number of cores in this->NumberOfPhysicalCPU
  // (checking only the first proc)
  std::string Cores = this->ExtractValueFromCpuInfoFile(buffer, "cpu cores");
  if (Cores.empty()) {
    // Linux Sparc is different
    Cores = this->ExtractValueFromCpuInfoFile(buffer, "ncpus probed");
  }
  auto NumberOfCoresPerSocket = (unsigned int)atoi(Cores.c_str());
  NumberOfCoresPerSocket = std::max(NumberOfCoresPerSocket, 1u);
  this->NumberOfPhysicalCPU =
    NumberOfCoresPerSocket * (unsigned int)NumberOfSockets;

#else
  // For systems which do not have "physical id" entries, neither "cpu cores"
  // this has to be fixed for hyper-threading.
  std::string cpucount =
    this->ExtractValueFromCpuInfoFile(buffer, "cpu count");
  this->NumberOfPhysicalCPU = this->NumberOfLogicalCPU =
    atoi(cpucount.c_str());
#endif
  // gotta have one, and if this is 0 then we get a / by 0n
  // better to have a bad answer than a crash
  if (this->NumberOfPhysicalCPU <= 0) {
    this->NumberOfPhysicalCPU = 1;
  }
  if (this->NumberOfLogicalCPU == 0) {
    this->NumberOfLogicalCPU = this->NumberOfPhysicalCPU;
  }
  // LogicalProcessorsPerPhysical>1 => SMT.
  this->Features.ExtendedFeatures.LogicalProcessorsPerPhysical =
    this->NumberOfLogicalCPU / this->NumberOfPhysicalCPU;

  // CPU speed (checking only the first processor)
  std::string CPUSpeed = this->ExtractValueFromCpuInfoFile(buffer, "cpu MHz");
  if (!CPUSpeed.empty()) {
    this->CPUSpeedInMHz = static_cast<float>(atof(CPUSpeed.c_str()));
  }
#ifdef __linux
  else {
    // Linux Sparc: CPU speed is in Hz and encoded in hexadecimal
    CPUSpeed = this->ExtractValueFromCpuInfoFile(buffer, "Cpu0ClkTck");
    if (!CPUSpeed.empty()) {
      this->CPUSpeedInMHz =
        static_cast<float>(strtoull(CPUSpeed.c_str(), nullptr, 16)) /
        1000000.0f;
    } else {
      // if the kernel is build as Sparc32 it's in decimal, note the different
      // case
      CPUSpeed = this->ExtractValueFromCpuInfoFile(buffer, "CPU0ClkTck");
      this->CPUSpeedInMHz =
        static_cast<float>(strtoull(CPUSpeed.c_str(), nullptr, 10)) /
        1000000.0f;
    }
  }
#endif

  // Chip family
  std::string familyStr =
    this->ExtractValueFromCpuInfoFile(buffer, "cpu family");
  if (familyStr.empty()) {
    familyStr = this->ExtractValueFromCpuInfoFile(buffer, "CPU architecture");
  }
  this->ChipID.Family = atoi(familyStr.c_str());

  // Chip Vendor
  this->ChipID.Vendor = this->ExtractValueFromCpuInfoFile(buffer, "vendor_id");
  this->FindManufacturer(familyStr);

  // second try for setting family
  if (this->ChipID.Family == 0 && this->ChipManufacturer == HP) {
    if (familyStr == "PA-RISC 1.1a")
      this->ChipID.Family = 0x11a;
    else if (familyStr == "PA-RISC 2.0")
      this->ChipID.Family = 0x200;
    // If you really get CMake to work on a machine not belonging to
    // any of those families I owe you a dinner if you get it to
    // contribute nightly builds regularly.
  }

  // Chip Model
  this->ChipID.Model =
    atoi(this->ExtractValueFromCpuInfoFile(buffer, "model").c_str());
  if (!this->RetrieveClassicalCPUIdentity()) {
    // Some platforms (e.g. PA-RISC) tell us their CPU name here.
    // Note: x86 does not.
    std::string cpuname = this->ExtractValueFromCpuInfoFile(buffer, "cpu");
    if (!cpuname.empty()) {
      this->ChipID.ProcessorName = cpuname;
    }
  }

  // Chip revision
  std::string cpurev = this->ExtractValueFromCpuInfoFile(buffer, "stepping");
  if (cpurev.empty()) {
    cpurev = this->ExtractValueFromCpuInfoFile(buffer, "CPU revision");
  }
  this->ChipID.Revision = atoi(cpurev.c_str());

  // Chip Model Name
  this->ChipID.ModelName =
    this->ExtractValueFromCpuInfoFile(buffer, "model name");

  // L1 Cache size
  // Different architectures may show different names for the caches.
  // Sum up everything we find.
  std::vector<const char*> cachename;
  cachename.clear();

  cachename.push_back("cache size"); // e.g. x86
  cachename.push_back("I-cache");    // e.g. PA-RISC
  cachename.push_back("D-cache");    // e.g. PA-RISC

  this->Features.L1CacheSize = 0;
  for (auto& index : cachename) {
    std::string cacheSize = this->ExtractValueFromCpuInfoFile(buffer, index);
    if (!cacheSize.empty()) {
      pos = cacheSize.find(" KB");
      if (pos != std::string::npos) {
        cacheSize.resize(pos);
      }
      this->Features.L1CacheSize += atoi(cacheSize.c_str());
    }
  }

  // processor feature flags (probably x86 specific)
  std::string cpuflags = this->ExtractValueFromCpuInfoFile(buffer, "flags");
  if (!cpurev.empty()) {
    // now we can match every flags as space + flag + space
    cpuflags = " " + cpuflags + " ";
    if ((cpuflags.find(" fpu ") != std::string::npos)) {
      this->Features.HasFPU = true;
    }
    if ((cpuflags.find(" tsc ") != std::string::npos)) {
      this->Features.HasTSC = true;
    }
    if ((cpuflags.find(" mmx ") != std::string::npos)) {
      this->Features.HasMMX = true;
    }
    if ((cpuflags.find(" sse ") != std::string::npos)) {
      this->Features.HasSSE = true;
    }
    if ((cpuflags.find(" sse2 ") != std::string::npos)) {
      this->Features.HasSSE2 = true;
    }
    if ((cpuflags.find(" apic ") != std::string::npos)) {
      this->Features.HasAPIC = true;
    }
    if ((cpuflags.find(" cmov ") != std::string::npos)) {
      this->Features.HasCMOV = true;
    }
    if ((cpuflags.find(" mtrr ") != std::string::npos)) {
      this->Features.HasMTRR = true;
    }
    if ((cpuflags.find(" acpi ") != std::string::npos)) {
      this->Features.HasACPI = true;
    }
    if ((cpuflags.find(" 3dnow ") != std::string::npos)) {
      this->Features.ExtendedFeatures.Has3DNow = true;
    }
  }

  return true;
}